

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

int N_VConstrMask_SensWrapper(N_Vector c,N_Vector x,N_Vector m)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  
  plVar2 = (long *)x->content;
  if ((int)plVar2[1] < 1) {
    iVar3 = 1;
  }
  else {
    iVar3 = 1;
    lVar4 = 0;
    do {
      iVar1 = N_VConstrMask(c,*(N_Vector *)(*plVar2 + lVar4 * 8),
                            *(N_Vector *)(*m->content + lVar4 * 8));
      if (iVar1 != 1) {
        iVar3 = 0;
      }
      lVar4 = lVar4 + 1;
      plVar2 = (long *)x->content;
    } while (lVar4 < (int)plVar2[1]);
  }
  return iVar3;
}

Assistant:

booleantype N_VConstrMask_SensWrapper(N_Vector c, N_Vector x, N_Vector m)
{
  int i;
  booleantype test, tmp;

  test = SUNTRUE;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VConstrMask(c, NV_VEC_SW(x,i), NV_VEC_SW(m,i));
    if (tmp != SUNTRUE) test = SUNFALSE;
  }

  return(test);
}